

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O1

void Psr_ManWriteVerilog(char *pFileName,Vec_Ptr_t *vPrs)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Psr_Ntk_t *p;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  FILE *__stream;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  Vec_Int_t *vSigs [4];
  Vec_Int_t *local_78 [4];
  Vec_Int_t *local_58 [5];
  
  if (vPrs->nSize < 1) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)*vPrs->pArray;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  pcVar9 = Abc_NamStr(*(Abc_Nam_t **)(piVar15 + 2),*piVar15);
  Extra_TimeStamp();
  fprintf(__stream,"// Design \"%s\" written by ABC on %s\n\n",pcVar9);
  if (0 < vPrs->nSize) {
    lVar11 = 0;
    do {
      p = (Psr_Ntk_t *)vPrs->pArray[lVar11];
      pcVar9 = Abc_NamStr(p->pStrs,p->iModuleName);
      fprintf(__stream,"module %s (\n    ",pcVar9);
      if (0 < (p->vOrder).nSize) {
        uVar12 = 0;
        do {
          pcVar10 = Abc_NamStr(p->pStrs,(p->vOrder).pArray[uVar12]);
          pcVar9 = "    \"%s\", ";
          if (uVar12 == (p->vOrder).nSize - 1) {
            pcVar9 = "T = %d\t\t";
          }
          fprintf(__stream,"%s%s",pcVar10,pcVar9 + 8);
          uVar12 = uVar12 + 1;
        } while ((long)uVar12 < (long)(p->vOrder).nSize);
      }
      fwrite("\n  );\n",6,1,__stream);
      lVar13 = 0;
      do {
        local_58[0] = &p->vInouts;
        local_58[1] = &p->vInputs;
        local_58[2] = &p->vOutputs;
        local_58[3] = &p->vWires;
        local_78[0] = &p->vInoutsR;
        local_78[1] = &p->vInputsR;
        local_78[2] = &p->vOutputsR;
        local_78[3] = &p->vWiresR;
        if (lVar13 == 3) {
          fputc(10,__stream);
        }
        pVVar5 = local_58[lVar13];
        if (0 < pVVar5->nSize) {
          pVVar6 = local_78[lVar13];
          lVar14 = 0;
          do {
            pcVar9 = "";
            if (pVVar6->nSize <= lVar14) goto LAB_003c6bd9;
            iVar2 = pVVar5->pArray[lVar14];
            iVar3 = pVVar6->pArray[lVar14];
            iVar4 = *(int *)(&DAT_009a3754 + lVar13 * 4);
            if (iVar3 != 0) {
              pcVar9 = Abc_NamStr(p->pStrs,iVar3);
            }
            Abc_NamStr(p->pStrs,iVar2);
            fprintf(__stream,"  %s %s%s;\n",&DAT_009a3754 + iVar4,pcVar9);
            lVar14 = lVar14 + 1;
          } while (lVar14 < pVVar5->nSize);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      fputc(10,__stream);
      if (0 < (p->vObjs).nSize) {
        lVar13 = 0;
        do {
          piVar15 = (p->vObjs).pArray;
          iVar2 = piVar15[lVar13];
          if (((long)iVar2 < 0) || (iVar3 = (p->vBoxes).nSize, iVar3 <= iVar2)) {
LAB_003c6bd9:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar7 = (p->vBoxes).pArray;
          Psr_BoxSignals_V._0_4_ = piVar7[iVar2] + -2;
          iVar2 = piVar15[lVar13];
          Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
          if (((long)iVar2 < -3) || (iVar3 <= (int)(iVar2 + 3U))) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          Psr_BoxSignals_V._8_8_ = piVar7 + (iVar2 + 3U);
          if (iVar2 < -1) goto LAB_003c6bd9;
          iVar2 = piVar7[(long)iVar2 + 1];
          if (iVar2 == 0x14) {
            if (Psr_BoxSignals_V._0_4_ != 8) {
              __assert_fail("Vec_IntSize(vSigs) == 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x60,"void Psr_ManWriteVerilogMux(FILE *, Psr_Ntk_t *, Vec_Int_t *)");
            }
            fwrite("  assign ",9,1,__stream);
            if ((long)(int)Psr_BoxSignals_V._4_4_ < 1) {
LAB_003c6c17:
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
            }
            Psr_ManWriteVerilogSignal
                      ((FILE *)__stream,p,
                       *(int *)(Psr_BoxSignals_V._8_8_ + -4 + (long)(int)Psr_BoxSignals_V._4_4_ * 4)
                      );
            fputs(" = ",__stream);
            if (1 < (int)Psr_BoxSignals_V._4_4_) {
              lVar14 = 0;
              do {
                Psr_ManWriteVerilogSignal
                          ((FILE *)__stream,p,*(int *)(Psr_BoxSignals_V._8_8_ + 4 + lVar14 * 4));
                fputs(&DAT_009a3764 + *(int *)((long)&DAT_009a3768 + lVar14 * 2),__stream);
                if (lVar14 == 4) break;
                lVar1 = lVar14 + 3;
                lVar14 = lVar14 + 2;
              } while (lVar1 < (int)Psr_BoxSignals_V._4_4_);
            }
          }
          else {
            if (*(int *)Psr_BoxSignals_V._8_8_ == 0) {
              uVar8 = iVar2 - 6;
              if ((0xf < uVar8) || ((0xbfffU >> (uVar8 & 0x1f) & 1) == 0)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                              ,0x3ab,"char *Ptr_TypeToName(Bac_ObjType_t)");
              }
              fprintf(__stream,"  %s (",&DAT_009a3774 + *(int *)(&DAT_009a3774 + (ulong)uVar8 * 4));
              if ((long)(int)Psr_BoxSignals_V._4_4_ < 1) goto LAB_003c6c17;
              Psr_ManWriteVerilogSignal
                        ((FILE *)__stream,p,
                         *(int *)(Psr_BoxSignals_V._8_8_ + -4 +
                                 (long)(int)Psr_BoxSignals_V._4_4_ * 4));
              if ((p->vObjs).nSize <= lVar13) goto LAB_003c6bd9;
              iVar2 = (p->vObjs).pArray[lVar13];
              if (((long)iVar2 < 0) || ((p->vBoxes).nSize <= iVar2)) goto LAB_003c6bd9;
              if (5 < (p->vBoxes).pArray[iVar2]) {
                fwrite(", ",2,1,__stream);
              }
              Psr_ManWriteVerilogArray
                        ((FILE *)__stream,p,(Vec_Int_t *)Psr_BoxSignals_V,0,
                         Psr_BoxSignals_V._4_4_ + -2,1);
            }
            else {
              pcVar9 = Abc_NamStr(p->pStrs,iVar2);
              if ((((p->vObjs).nSize <= lVar13) || (iVar2 = (p->vObjs).pArray[lVar13], iVar2 < -2))
                 || (uVar8 = iVar2 + 2, (p->vBoxes).nSize <= (int)uVar8)) goto LAB_003c6bd9;
              iVar2 = (p->vBoxes).pArray[uVar8];
              pcVar10 = "";
              if (iVar2 != 0) {
                pcVar10 = Abc_NamStr(p->pStrs,iVar2);
              }
              fprintf(__stream,"  %s %s (",pcVar9,pcVar10);
              if ((Psr_BoxSignals_V._4_4_ & 1) != 0) {
                __assert_fail("Vec_IntSize(vSigs) % 2 == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x52,
                              "void Psr_ManWriteVerilogArray2(FILE *, Psr_Ntk_t *, Vec_Int_t *)");
              }
              if (1 < (int)Psr_BoxSignals_V._4_4_) {
                lVar14 = 1;
                do {
                  iVar2 = *(int *)(Psr_BoxSignals_V._8_8_ + -4 + lVar14 * 4);
                  iVar3 = *(int *)(Psr_BoxSignals_V._8_8_ + lVar14 * 4);
                  fputc(0x2e,__stream);
                  pcVar9 = Abc_NamStr(p->pStrs,iVar2);
                  fputs(pcVar9,__stream);
                  fputc(0x28,__stream);
                  Psr_ManWriteVerilogSignal((FILE *)__stream,p,iVar3);
                  pcVar9 = "    \"%s\", ";
                  if (lVar14 - 1U == (ulong)(Psr_BoxSignals_V._4_4_ - 2)) {
                    pcVar9 = "T = %d\t\t";
                  }
                  fprintf(__stream,")%s",pcVar9 + 8);
                  lVar14 = lVar14 + 2;
                } while ((int)lVar14 < (int)Psr_BoxSignals_V._4_4_);
              }
            }
            fwrite(");\n",3,1,__stream);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (p->vObjs).nSize);
      }
      fwrite("endmodule\n\n",0xb,1,__stream);
      lVar11 = lVar11 + 1;
    } while (lVar11 < vPrs->nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

void Psr_ManWriteVerilog( char * pFileName, Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot(vPrs); int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Design \"%s\" written by ABC on %s\n\n", Psr_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_ManWriteVerilogNtk( pFile, pNtk );
    fclose( pFile );
}